

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwarmonDevice.h
# Opt level: O2

int ConnectSwarmonDevice(SWARMONDEVICE *pSwarmonDevice,char *szCfgFilePath)

{
  char *port;
  char *__haystack;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char line [256];
  
  memset(pSwarmonDevice->szCfgFilePath,0,0x100);
  sprintf(pSwarmonDevice->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(line,0,0x100);
    memset(pSwarmonDevice->szRequest + 0x33,0,0xcd);
    builtin_strncpy(pSwarmonDevice->szRequest,"http://193.52.45.70:3000/rt/lastposition/robotTest",
                    0x33);
    pSwarmonDevice->threadperiod = 100;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%255s",pSwarmonDevice->szRequest);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pSwarmonDevice->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_0016ced4;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_0016ced4:
  if (pSwarmonDevice->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pSwarmonDevice->threadperiod = 100;
  }
  (pSwarmonDevice->LastSwarmonData).Longitude = 0.0;
  (pSwarmonDevice->LastSwarmonData).Azimuth = 0.0;
  *(undefined8 *)&pSwarmonDevice->LastSwarmonData = 0;
  (pSwarmonDevice->LastSwarmonData).Latitude = 0.0;
  (pSwarmonDevice->LastSwarmonData).Speed = 0.0;
  pcVar2 = pSwarmonDevice->address;
  port = pSwarmonDevice->port;
  __haystack = pSwarmonDevice->szRequest;
  memset(pcVar2,0,0x300);
  pcVar3 = strstr(__haystack,"http://");
  pcVar5 = port;
  if (pcVar3 == (char *)0x0) {
    pSwarmonDevice->DevType = 0;
    pcVar3 = strchr(__haystack,0x3a);
    if (pcVar3 == (char *)0x0) goto LAB_0016cff8;
    memcpy(pcVar2,__haystack,(long)pcVar3 - (long)__haystack);
LAB_0016cfe8:
    pcVar4 = pcVar3 + 1;
  }
  else {
    pSwarmonDevice->DevType = 1;
    pcVar3 = pcVar3 + 7;
    pcVar4 = strchr(pcVar3,0x3a);
    if (pcVar4 == (char *)0x0) goto LAB_0016cff8;
    memcpy(pcVar2,pcVar3,(long)pcVar4 - (long)pcVar3);
    pcVar4 = pcVar4 + 1;
    pcVar3 = strchr(pcVar4,0x2f);
    if (pcVar3 != (char *)0x0) {
      memcpy(port,pcVar4,(long)pcVar3 - (long)pcVar4);
      pcVar5 = pSwarmonDevice->resource;
      goto LAB_0016cfe8;
    }
  }
  strcpy(pcVar5,pcVar4);
LAB_0016cff8:
  if ((*pcVar2 == '\0') || (*port == '\0')) {
    puts("Invalid parameter : szRequest.");
    memset(pSwarmonDevice->szRequest + 0x33,0,0xcd);
    builtin_strncpy(__haystack,"http://193.52.45.70:3000/rt/lastposition/robotTest",0x33);
    builtin_strncpy(pcVar2,"193.52.45.70",0xd);
    builtin_strncpy(port,"3000",5);
    builtin_strncpy(pSwarmonDevice->resource,"rt/lastposition/robotTest",0x1a);
    pSwarmonDevice->DevType = 1;
  }
  iVar1 = inittcpcli(&pSwarmonDevice->s,pcVar2,port);
  pcVar2 = "SwarmonDevice connected.";
  if (iVar1 != 0) {
    pcVar2 = "Unable to connect to a SwarmonDevice.";
  }
  puts(pcVar2);
  return (int)(iVar1 != 0);
}

Assistant:

inline int ConnectSwarmonDevice(SWARMONDEVICE* pSwarmonDevice, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char* ptr0 = NULL;
	char* ptr1 = NULL;
	char* ptr2 = NULL;

	memset(pSwarmonDevice->szCfgFilePath, 0, sizeof(pSwarmonDevice->szCfgFilePath));
	sprintf(pSwarmonDevice->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pSwarmonDevice->szRequest, 0, sizeof(pSwarmonDevice->szRequest));
		sprintf(pSwarmonDevice->szRequest, "http://193.52.45.70:3000/rt/lastposition/robotTest");
		pSwarmonDevice->threadperiod = 100;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pSwarmonDevice->szRequest) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSwarmonDevice->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pSwarmonDevice->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pSwarmonDevice->threadperiod = 100;
	}

	memset(&pSwarmonDevice->LastSwarmonData, 0, sizeof(SWARMONDATA));

	memset(pSwarmonDevice->address, 0, sizeof(pSwarmonDevice->address));
	memset(pSwarmonDevice->port, 0, sizeof(pSwarmonDevice->port));
	memset(pSwarmonDevice->resource, 0, sizeof(pSwarmonDevice->resource));

	// Try to determine whether it is an HTTP request or an IP address and TCP port.
	ptr0 = strstr(pSwarmonDevice->szRequest, "http://");
	if (ptr0)
	{
		pSwarmonDevice->DevType = SWARMONDEVICE_TYPE_INTERNET;
		ptr1 = strchr(ptr0+strlen("http://"), ':');
		if (ptr1)
		{
			memcpy(pSwarmonDevice->address, ptr0+strlen("http://"), ptr1-(ptr0+strlen("http://")));
			ptr2 = strchr(ptr1+1, '/');
			if (ptr2)
			{
				memcpy(pSwarmonDevice->port, ptr1+1, ptr2-(ptr1+1));
				strcpy(pSwarmonDevice->resource, ptr2+1);
			}
			else
			{
				strcpy(pSwarmonDevice->port, ptr1+1);
			}
		}
	}
	else
	{
		pSwarmonDevice->DevType = SWARMONDEVICE_TYPE_LOCAL;
		ptr0 = strchr(pSwarmonDevice->szRequest, ':');
		if (ptr0)
		{
			memcpy(pSwarmonDevice->address, pSwarmonDevice->szRequest, ptr0-pSwarmonDevice->szRequest);
			strcpy(pSwarmonDevice->port, ptr0+1);
		}
	}

	if (!(pSwarmonDevice->address[0])||!(pSwarmonDevice->port[0]))
	{
		printf("Invalid parameter : szRequest.\n");
		memset(pSwarmonDevice->szRequest, 0, sizeof(pSwarmonDevice->szRequest));
		sprintf(pSwarmonDevice->szRequest, "http://193.52.45.70:3000/rt/lastposition/robotTest");
		sprintf(pSwarmonDevice->address, "193.52.45.70");
		sprintf(pSwarmonDevice->port, "3000");
		sprintf(pSwarmonDevice->resource, "rt/lastposition/robotTest");
		pSwarmonDevice->DevType = SWARMONDEVICE_TYPE_INTERNET;
	}

	if (inittcpcli(&pSwarmonDevice->s, pSwarmonDevice->address, pSwarmonDevice->port) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a SwarmonDevice.\n");
		return EXIT_FAILURE;
	}

	printf("SwarmonDevice connected.\n");

	return EXIT_SUCCESS;
}